

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexManager.cpp
# Opt level: O0

void __thiscall Indexing::IndexManager::IndexManager(IndexManager *this,SaturationAlgorithm *alg)

{
  bool bVar1;
  UnificationWithAbstraction UVar2;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  Lib::
  DHMap<Indexing::IndexType,_Indexing::IndexManager::Entry,_Lib::DefaultHash,_Lib::DefaultHash2>::
  DHMap((DHMap<Indexing::IndexType,_Indexing::IndexManager::Entry,_Lib::DefaultHash,_Lib::DefaultHash2>
         *)(in_RDI + 1));
  UVar2 = Kernel::AbstractionOracle::create();
  *(UnificationWithAbstraction *)(in_RDI + 6) = UVar2;
  bVar1 = Shell::Options::unificationWithAbstractionFixedPointIteration(Lib::env);
  *(bool *)((long)in_RDI + 0x34) = bVar1;
  return;
}

Assistant:

IndexManager::IndexManager(SaturationAlgorithm* alg)
  : _alg(alg)
  , _uwa(AbstractionOracle::create())
  , _uwaFixedPointIteration(env.options->unificationWithAbstractionFixedPointIteration())
{ }